

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O1

string * deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::generateComputeShader
                   (string *__return_storage_ptr__,NegativeTestContext *ctx,
                   string *shaderDeclarations,string *shaderBody)

{
  bool bVar1;
  ContextType ctxType;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  ostringstream compShaderSource;
  undefined1 local_198 [376];
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  __s = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(_func_int **)(local_198._0_8_ + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x41);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(shaderDeclarations->_M_dataplus)._M_p,
                      shaderDeclarations->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(shaderBody->_M_dataplus)._M_p,shaderBody->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string generateComputeShader (NegativeTestContext& ctx, const string& shaderDeclarations, const string& shaderBody)
{
	const bool			isES32			= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const char* const	shaderVersion	= isES32
										? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES)
										: getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	std::ostringstream compShaderSource;

	compShaderSource	<<	shaderVersion << "\n"
						<<	"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
						<<	shaderDeclarations << "\n"
						<<	"void main (void)\n"
						<<	"{\n"
						<<	shaderBody
						<<	"}\n";

	return compShaderSource.str();
}